

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O2

void __thiscall QHttpMultiPartPrivate::~QHttpMultiPartPrivate(QHttpMultiPartPrivate *this)

{
  ~QHttpMultiPartPrivate(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

QHttpMultiPartPrivate::~QHttpMultiPartPrivate()
{
    delete device;
}